

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesOverclockGetVFPointValues
          (zes_overclock_handle_t hDomainHandle,zes_vf_type_t VFType,zes_vf_array_type_t VFArrayType
          ,uint32_t PointIndex,uint32_t *PointValue)

{
  zes_pfnOverclockGetVFPointValues_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnOverclockGetVFPointValues_t pfnGetVFPointValues;
  uint32_t *PointValue_local;
  uint32_t PointIndex_local;
  zes_vf_array_type_t VFArrayType_local;
  zes_vf_type_t VFType_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Overclock).pfnGetVFPointValues;
    if (p_Var1 == (zes_pfnOverclockGetVFPointValues_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDomainHandle_local._4_4_ = (*p_Var1)(hDomainHandle,VFType,VFArrayType,PointIndex,PointValue);
    }
  }
  else {
    hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDomainHandle_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesOverclockGetVFPointValues(
    zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
    zes_vf_type_t VFType,                           ///< [in] Voltage or Freqency point to read.
    zes_vf_array_type_t VFArrayType,                ///< [in] User,Default or Live VF array to read from
    uint32_t PointIndex,                            ///< [in] Point index - number between (0, max_num_points - 1).
    uint32_t* PointValue                            ///< [out] Returns the frequency in 1kHz units or voltage in millivolt
                                                    ///< units from the custom V-F curve at the specified zero-based index 
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnOverclockGetVFPointValues_t pfnGetVFPointValues = [&result] {
        auto pfnGetVFPointValues = ze_lib::context->zesDdiTable.load()->Overclock.pfnGetVFPointValues;
        if( nullptr == pfnGetVFPointValues ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetVFPointValues;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetVFPointValues( hDomainHandle, VFType, VFArrayType, PointIndex, PointValue );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetVFPointValues = ze_lib::context->zesDdiTable.load()->Overclock.pfnGetVFPointValues;
    if( nullptr == pfnGetVFPointValues ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetVFPointValues( hDomainHandle, VFType, VFArrayType, PointIndex, PointValue );
    #endif
}